

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int bmp_test(stbi *s)

{
  int iVar1;
  uint32 uVar2;
  int iVar3;
  
  iVar1 = get8(s);
  iVar3 = 0;
  if (iVar1 == 0x42) {
    iVar1 = get8(s);
    iVar3 = 0;
    if (iVar1 == 0x4d) {
      get32le(s);
      get8(s);
      get8(s);
      get8(s);
      get8(s);
      get32le(s);
      uVar2 = get32le(s);
      iVar3 = 1;
      if (((0x38 < uVar2) || ((0x100010000001000U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
         (uVar2 != 0x6c)) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int bmp_test(stbi *s)
{
   int sz;
   if (get8(s) != 'B') return 0;
   if (get8(s) != 'M') return 0;
   get32le(s); // discard filesize
   get16le(s); // discard reserved
   get16le(s); // discard reserved
   get32le(s); // discard data offset
   sz = get32le(s);
   if (sz == 12 || sz == 40 || sz == 56 || sz == 108) return 1;
   return 0;
}